

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::drawPixmapFragments
          (QOpenGL2PaintEngineExPrivate *this,PixmapFragment *fragments,int fragmentCount,
          QPixmap *pixmap,PixmapFragmentHints hints)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Int IVar5;
  QOpenGL2PaintEngineState *pQVar6;
  QOpenGLPoint *texture;
  QOpenGLPoint *pQVar7;
  QOpenGL2PaintEngineExPrivate *this_00;
  ulong uVar8;
  int in_EDX;
  PixelSrcType type;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  QColor QVar12;
  bool isOpaque;
  bool isBitmap;
  GLenum filterMode;
  qreal opacity;
  qreal bottom;
  qreal right;
  qreal c;
  qreal s;
  int i;
  bool allOpaque;
  GLfloat dy;
  GLfloat dx;
  QOpenGLRect src;
  QOpenGLPoint bottomLeft;
  QOpenGLPoint bottomRight;
  QColor col;
  GLuint in_stack_fffffffffffffeb8;
  PixmapFragmentHint in_stack_fffffffffffffebc;
  QOpenGL2PaintEngineExPrivate *in_stack_fffffffffffffec0;
  QOpenGLShaderProgram *in_stack_fffffffffffffec8;
  QOpenGL2PEXVertexArray *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  EngineMode newMode;
  GLfloat opacity_00;
  QOpenGL2PaintEngineExPrivate *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 uVar13;
  double local_e0;
  double local_d8;
  int local_d0;
  bool local_c9;
  undefined8 local_a0;
  undefined2 uStack_8a;
  undefined6 local_88;
  QFlagsStorageHelper<QPainter::PixmapFragmentHint,_4> local_7c;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  QOpenGLRect local_5c;
  QOpenGLPoint local_4c;
  QOpenGLPoint local_44;
  undefined8 local_3c;
  undefined8 local_34;
  undefined6 uStack_28;
  undefined2 local_22;
  undefined6 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = QPixmap::size();
  iVar3 = QSize::width((QSize *)0x164c02);
  local_3c = QPixmap::size();
  iVar4 = QSize::height((QSize *)0x164c3d);
  QOpenGL2PEXVertexArray::clear((QOpenGL2PEXVertexArray *)in_stack_fffffffffffffec0);
  QOpenGL2PEXVertexArray::clear((QOpenGL2PEXVertexArray *)in_stack_fffffffffffffec0);
  QDataBuffer<float>::reset((QDataBuffer<float> *)(in_RDI + 0x368));
  if ((*(byte *)(in_RDI + 0x3c0) & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x3c0) = 0;
    *(undefined1 *)(in_RDI + 0x263) = 1;
  }
  local_c9 = true;
  for (local_d0 = 0; newMode = (EngineMode)((ulong)in_stack_fffffffffffffed8 >> 0x20),
      local_d0 < in_EDX; local_d0 = local_d0 + 1) {
    local_d8 = 0.0;
    local_e0 = 1.0;
    dVar9 = *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x40);
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar9 = qDegreesToRadians(*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x40));
      local_d8 = qFastSin(dVar9);
      dVar9 = qDegreesToRadians(*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x40));
      local_e0 = qFastCos(dVar9);
    }
    dVar9 = *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x30) * 0.5 *
            *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x20);
    dVar10 = *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x38) * 0.5 *
             *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x28);
    local_44.x = -NAN;
    local_44.y = -NAN;
    QOpenGLPoint::QOpenGLPoint
              (&local_44,(float)(dVar9 * local_e0 + -(dVar10 * local_d8)),
               (float)(dVar9 * local_d8 + dVar10 * local_e0));
    local_4c.x = -NAN;
    local_4c.y = -NAN;
    QOpenGLPoint::QOpenGLPoint
              (&local_4c,(float)(-dVar9 * local_e0 + -(dVar10 * local_d8)),
               (float)(-dVar9 * local_d8 + dVar10 * local_e0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    local_5c.left = -NAN;
    local_5c.top = -NAN;
    local_5c.right = -NAN;
    local_5c.bottom = -NAN;
    QOpenGLRect::QOpenGLRect
              (&local_5c,
               (float)(*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x10) *
                      (double)(1.0 / (float)iVar3)),
               (float)(*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x18) *
                      (double)(1.0 / (float)iVar4)),
               (float)((*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x10) +
                       *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x20)) *
                      (double)(1.0 / (float)iVar3)),
               (float)((*(double *)(in_RSI + (long)local_d0 * 0x50 + 0x18) +
                       *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x28)) *
                      (double)(1.0 / (float)iVar4)));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    QOpenGL2PEXVertexArray::addVertex
              (in_stack_fffffffffffffed0,(GLfloat)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB84(in_stack_fffffffffffffec8,0));
    dVar9 = *(double *)(in_RSI + (long)local_d0 * 0x50 + 0x48);
    pQVar6 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1653b8);
    dVar9 = dVar9 * *(double *)&pQVar6->field_0x198;
    local_60 = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_64 = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_68 = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_6c = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_70 = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_74 = (float)dVar9;
    QDataBuffer<float>::operator<<
              ((QDataBuffer<float> *)in_stack_fffffffffffffec0,
               (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_c9 = (local_c9 & 0.9900000095367432 <= dVar9) != 0;
  }
  transferMode(in_stack_fffffffffffffee0,newMode);
  texture = QOpenGL2PEXVertexArray::data((QOpenGL2PEXVertexArray *)0x165508);
  QOpenGL2PEXVertexArray::vertexCount((QOpenGL2PEXVertexArray *)0x16551e);
  uploadData(in_stack_fffffffffffffee0,newMode,&texture->x,
             (GLuint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  pQVar7 = QOpenGL2PEXVertexArray::data((QOpenGL2PEXVertexArray *)0x165544);
  opacity_00 = (GLfloat)((ulong)pQVar7 >> 0x20);
  QOpenGL2PEXVertexArray::vertexCount((QOpenGL2PEXVertexArray *)0x16555a);
  uploadData(in_stack_fffffffffffffee0,(uint)opacity_00,&texture->x,
             (GLuint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  this_00 = (QOpenGL2PaintEngineExPrivate *)
            QDataBuffer<float>::data((QDataBuffer<float> *)(in_RDI + 0x368));
  QDataBuffer<float>::size((QDataBuffer<float> *)(in_RDI + 0x368));
  uploadData(this_00,(uint)opacity_00,&texture->x,(GLuint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
            );
  QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1655c0);
  local_78.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&
                 ((QFlags<QPainter::RenderHint> *)in_stack_fffffffffffffec0,
                  in_stack_fffffffffffffebc);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_78);
  updateTexture<QPixmap>
            (this_00,(GLenum)opacity_00,(QPixmap *)texture,
             (GLenum)((ulong)in_stack_fffffffffffffec8 >> 0x20),(GLenum)in_stack_fffffffffffffec8,
             (TextureUpdateMode)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  bVar1 = QPixmap::isQBitmap();
  bVar1 = bVar1 & 1;
  uVar13 = false;
  if (bVar1 == 0) {
    uVar8 = QPixmap::hasAlpha();
    if ((uVar8 & 1) != 0) {
      local_7c.super_QFlagsStorage<QPainter::PixmapFragmentHint>.i =
           (QFlagsStorage<QPainter::PixmapFragmentHint>)
           QFlags<QPainter::PixmapFragmentHint>::operator&
                     ((QFlags<QPainter::PixmapFragmentHint> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc);
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
      uVar13 = false;
      if (IVar5 == 0) goto LAB_0016568b;
    }
    uVar13 = local_c9;
  }
LAB_0016568b:
  QBrush::operator=((QBrush *)(in_RDI + 0x290),(QBrush *)(in_RDI + 0x298));
  type = ImageSrc;
  if (bVar1 != 0) {
    type = PatternSrc;
  }
  QOpenGLEngineShaderManager::setSrcPixelType(*(QOpenGLEngineShaderManager **)(in_RDI + 0x230),type)
  ;
  bVar2 = prepareForDraw(this_00,SUB41((uint)opacity_00 >> 0x18,0));
  if (bVar2) {
    in_stack_fffffffffffffec8 =
         QOpenGLEngineShaderManager::currentProgram
                   ((QOpenGLEngineShaderManager *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    location(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    QOpenGLShaderProgram::setUniformValue
              ((QOpenGLShaderProgram *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               in_stack_fffffffffffffeb8);
  }
  if (bVar1 != 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    uStack_10 = 0xaaaaaaaaaaaaaaaa;
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x165749);
    auVar11 = QPen::color();
    local_88 = auVar11._8_6_;
    uStack_8a = auVar11._6_2_;
    uStack_20 = local_88;
    uStack_28 = auVar11._0_6_;
    local_22 = uStack_8a;
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x165799);
    QVar12._8_7_ = in_stack_fffffffffffffee8;
    QVar12._0_8_ = this_00;
    QVar12._15_1_ = uVar13;
    QVar12 = qt_premultiplyColor(QVar12,opacity_00);
    local_a0 = QVar12._0_8_;
    local_18 = local_a0;
    uStack_10._0_6_ = QVar12.ct._4_6_;
    in_stack_fffffffffffffec0 =
         (QOpenGL2PaintEngineExPrivate *)
         QOpenGLEngineShaderManager::currentProgram
                   ((QOpenGLEngineShaderManager *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    location(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    QOpenGLShaderProgram::setUniformValue
              (in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
               (QColor *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  QOpenGLFunctions::glDrawArrays
            ((QOpenGLFunctions *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             in_stack_fffffffffffffeb8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::drawPixmapFragments(const QPainter::PixmapFragment *fragments,
                                                   int fragmentCount, const QPixmap &pixmap,
                                                   QPainter::PixmapFragmentHints hints)
{
    GLfloat dx = 1.0f / pixmap.size().width();
    GLfloat dy = 1.0f / pixmap.size().height();

    vertexCoordinateArray.clear();
    textureCoordinateArray.clear();
    opacityArray.reset();

    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    bool allOpaque = true;

    for (int i = 0; i < fragmentCount; ++i) {
        qreal s = 0;
        qreal c = 1;
        if (fragments[i].rotation != 0) {
            s = qFastSin(qDegreesToRadians(fragments[i].rotation));
            c = qFastCos(qDegreesToRadians(fragments[i].rotation));
        }

        qreal right = 0.5 * fragments[i].scaleX * fragments[i].width;
        qreal bottom = 0.5 * fragments[i].scaleY * fragments[i].height;
        QOpenGLPoint bottomRight(right * c - bottom * s, right * s + bottom * c);
        QOpenGLPoint bottomLeft(-right * c - bottom * s, -right * s + bottom * c);

        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomLeft.x + fragments[i].x, -bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomLeft.x + fragments[i].x, bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);

        QOpenGLRect src(fragments[i].sourceLeft * dx, fragments[i].sourceTop * dy,
                    (fragments[i].sourceLeft + fragments[i].width) * dx,
                    (fragments[i].sourceTop + fragments[i].height) * dy);

        textureCoordinateArray.addVertex(src.right, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.bottom);

        qreal opacity = fragments[i].opacity * q->state()->opacity;
        opacityArray << opacity << opacity << opacity << opacity << opacity << opacity;
        allOpaque &= (opacity >= 0.99f);
    }

    transferMode(ImageOpacityArrayDrawingMode);

    uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
    uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);
    uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());

    GLenum filterMode = q->state()->renderHints & QPainter::SmoothPixmapTransform ? GL_LINEAR : GL_NEAREST;
    updateTexture(QT_IMAGE_TEXTURE_UNIT, pixmap, GL_CLAMP_TO_EDGE, filterMode);

    bool isBitmap = pixmap.isQBitmap();
    bool isOpaque = !isBitmap && (!pixmap.hasAlpha() || (hints & QPainter::OpaqueHint)) && allOpaque;

    // Setup for texture drawing
    currentBrush = noBrush;
    shaderManager->setSrcPixelType(isBitmap ? QOpenGLEngineShaderManager::PatternSrc
                                            : QOpenGLEngineShaderManager::ImageSrc);
    if (prepareForDraw(isOpaque))
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::ImageTexture), QT_IMAGE_TEXTURE_UNIT);

    if (isBitmap) {
        QColor col = qt_premultiplyColor(q->state()->pen.color(), (GLfloat)q->state()->opacity);
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::PatternColor), col);
    }

    funcs.glDrawArrays(GL_TRIANGLES, 0, 6 * fragmentCount);
}